

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void mir::inst::display_op(ostream *o,Op val)

{
  if (val < (ShrA|Sub)) {
    std::operator<<(o,&DAT_00194e68 + *(int *)(&DAT_00194e68 + (ulong)val * 4));
    return;
  }
  return;
}

Assistant:

void display_op(std::ostream& o, Op val) {
  switch (val) {
    case Op::Add:
      o << "+";
      break;
    case Op::Sub:
      o << "-";
      break;
    case Op::Mul:
      o << "*";
      break;
    case Op::MulSh:
      o << "MulSh";
      break;
    case Op::Div:
      o << "/";
      break;
    case Op::Rem:
      o << "%";
      break;
    case Op::Gt:
      o << ">";
      break;
    case Op::Lt:
      o << "<";
      break;
    case Op::Gte:
      o << ">=";
      break;
    case Op::Lte:
      o << "<=";
      break;
    case Op::Eq:
      o << "==";
      break;
    case Op::Neq:
      o << "!=";
      break;
    case Op::And:
      o << "&";
      break;
    case Op::Or:
      o << "|";
      break;
    case Op::Xor:
      o << "^";
      break;
    case Op::Not:
      o << "!";
      break;
    case Op::Shl:
      o << "<<";
      break;
    case Op::Shr:
      o << ">>>";
      break;
    case Op::ShrA:
      o << ">>";
      break;
  }
}